

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

void match_list_free(match_list *list)

{
  match *pmVar1;
  match *__ptr;
  
  __ptr = list->first;
  while (__ptr != (match *)0x0) {
    pmVar1 = __ptr->next;
    archive_mstring_clean(&__ptr->pattern);
    free(__ptr);
    __ptr = pmVar1;
  }
  return;
}

Assistant:

static void
match_list_free(struct match_list *list)
{
	struct match *p, *q;

	for (p = list->first; p != NULL; ) {
		q = p;
		p = p->next;
		archive_mstring_clean(&(q->pattern));
		free(q);
	}
}